

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalFilterAndGroup.cpp
# Opt level: O0

bool __thiscall IntervalFilterAndGroup::accepts(IntervalFilterAndGroup *this,Interval *interval)

{
  bool bVar1;
  uint uVar2;
  __shared_ptr_access<IntervalFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  shared_ptr<IntervalFilter> *filter;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
  *__range1;
  Interval *interval_local;
  IntervalFilterAndGroup *this_local;
  
  bVar1 = IntervalFilter::is_done(&this->super_IntervalFilter);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    __end1 = std::
             vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
             ::begin(&this->_filters);
    filter = (shared_ptr<IntervalFilter> *)
             std::
             vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
             ::end(&this->_filters);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::shared_ptr<IntervalFilter>_*,_std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>_>
                                       *)&filter), bVar1) {
      this_00 = (__shared_ptr_access<IntervalFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<IntervalFilter>_*,_std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>_>
                ::operator*(&__end1);
      peVar3 = std::__shared_ptr_access<IntervalFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      uVar2 = (**peVar3->_vptr_IntervalFilter)(peVar3,interval);
      if ((uVar2 & 1) == 0) {
        peVar3 = std::__shared_ptr_access<IntervalFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_00);
        bVar1 = IntervalFilter::is_done(peVar3);
        if (bVar1) {
          IntervalFilter::set_done(&this->super_IntervalFilter,true);
        }
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<IntervalFilter>_*,_std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IntervalFilterAndGroup::accepts (const Interval& interval)
{
  if (is_done ())
  {
    return false;
  }

  for (auto& filter: _filters)
  {
    if (filter->accepts (interval))
    {
      continue;
    }

    if (filter->is_done ())
    {
      set_done (true);
    }

    return false;
  }

  return true;
}